

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

shared_ptr<cppnet::BufferBlock> __thiscall
cppnet::List<cppnet::BufferBlock>::PopFront(List<cppnet::BufferBlock> *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  BufferBlock *__tmp;
  long lVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  int *in_RSI;
  shared_ptr<cppnet::BufferBlock> sVar5;
  
  lVar3 = *(long *)(in_RSI + 2);
  if (lVar3 == 0) {
    *(undefined8 *)this = 0;
    (this->_head).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
  }
  else {
    *(long *)this = lVar3;
    peVar1 = *(element_type **)(in_RSI + 4);
    (this->_head).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    if (peVar1 != (element_type *)0x0) {
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(peVar1->super_ListSlot<cppnet::BufferBlock>)._vptr_ListSlot =
             *(int *)&(peVar1->super_ListSlot<cppnet::BufferBlock>)._vptr_ListSlot + 1;
        UNLOCK();
        lVar3 = *(long *)(in_RSI + 2);
      }
      else {
        *(int *)&(peVar1->super_ListSlot<cppnet::BufferBlock>)._vptr_ListSlot =
             *(int *)&(peVar1->super_ListSlot<cppnet::BufferBlock>)._vptr_ListSlot + 1;
      }
    }
    lVar4 = *(long *)(lVar3 + 0x20);
    lVar3 = *(long *)(lVar3 + 0x28);
    if (lVar3 != 0) {
      in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(lVar3 + 8) = *(int *)(lVar3 + 8) + 1;
      }
    }
    *(long *)(in_RSI + 2) = lVar4;
    p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 4);
    *(long *)(in_RSI + 4) = lVar3;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      lVar4 = *(long *)(in_RSI + 2);
      in_RDX._M_pi = extraout_RDX;
    }
    if (lVar4 == 0) {
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(in_RSI + 8);
      in_RSI[6] = 0;
      in_RSI[7] = 0;
      in_RSI[8] = 0;
      in_RSI[9] = 0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        in_RDX._M_pi = extraout_RDX_00;
      }
    }
    *in_RSI = *in_RSI + -1;
  }
  sVar5.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<cppnet::BufferBlock>)
         sVar5.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> PopFront() {
        if (!_head) {
            return nullptr;
        }

        auto ret = _head;
        _head = _head->GetNext();
        if (!_head) {
            _tail.reset();
        }
        
        _size--;

        return ret;
    }